

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDesc.cpp
# Opt level: O1

Expected<renderdesc::Command::Flag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
renderdesc::flagFromValue_abi_cxx11_
          (Expected<renderdesc::Command::Flag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,renderdesc *this,Value *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  undefined8 uVar3;
  int iVar4;
  ExpectedRef<const_std::string,_std::string> s_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined8 local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined1 local_38 [32];
  bool local_18;
  
  yaml::Value::getString_abi_cxx11_
            ((ExpectedRef<const_std::string,_std::string> *)local_38,(Value *)this);
  uVar3 = local_38._0_8_;
  if (local_18 == false) {
    std::operator+(&local_78,"Cannot read Flag: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
LAB_001296be:
    sVar2 = local_78._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      local_48._8_8_ = local_78.field_2._8_8_;
      local_58 = &local_48;
    }
    else {
      local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_78._M_dataplus._M_p;
    }
    local_48._M_allocated_capacity._1_7_ = local_78.field_2._M_allocated_capacity._1_7_;
    local_48._M_local_buf[0] = local_78.field_2._M_local_buf[0];
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_0 = paVar1;
    if (local_58 == &local_48) {
      paVar1->_M_allocated_capacity = local_48._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
           local_48._8_8_;
    }
    else {
      (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = (pointer)local_58;
      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
           local_48._M_allocated_capacity;
    }
    (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar2;
    local_50 = 0;
    local_48._M_allocated_capacity = (ulong)(uint7)local_78.field_2._M_allocated_capacity._1_7_ << 8
    ;
    __return_storage_ptr__->has_value_ = false;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_58 = &local_48;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)local_38._0_8_);
    if (iVar4 == 0) {
      (__return_storage_ptr__->field_0).value_ = DepthTest;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)uVar3);
      if (iVar4 != 0) {
        format_abi_cxx11_(&local_78,"Unknown flag %s",*(undefined8 *)uVar3);
        goto LAB_001296be;
      }
      (__return_storage_ptr__->field_0).value_ = VertexProgramPointSize;
    }
    __return_storage_ptr__->has_value_ = true;
  }
  if ((local_18 == false) &&
     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_38 + 0x10))) {
    operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static Expected<Command::Flag, std::string> flagFromValue(const yaml::Value &v) {
	auto s_result = v.getString();
	if (!s_result)
		return Unexpected("Cannot read Flag: " + s_result.error());

	const std::string &s = s_result.value();
	if (s == "DepthTest") return Command::Flag::DepthTest;
#ifndef ATTO_PLATFORM_RPI
	if (s == "VertexProgramPointSize") return Command::Flag::VertexProgramPointSize;
#endif

	return Unexpected(format("Unknown flag %s", s.c_str()));
}